

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O1

float PsiER(float *ve,float *va)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  float sum;
  float fVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  float VA [3];
  float VE [3];
  float local_40 [6];
  double local_28;
  undefined8 uStack_20;
  
  local_28 = (double)CONCAT44(local_28._4_4_,*ve);
  local_40[3] = *ve;
  fVar7 = ve[1];
  local_40[4] = fVar7;
  local_40[5] = 1.0;
  fVar1 = *va;
  local_40[0] = fVar1;
  fVar2 = va[1];
  local_40[1] = fVar2;
  local_40[2] = 1.0;
  fVar4 = 0.0;
  lVar3 = 0;
  do {
    fVar4 = fVar4 + local_40[lVar3] * local_40[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar6 = 0.0;
  lVar3 = 0;
  do {
    fVar6 = fVar6 + local_40[lVar3 + 3] * local_40[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  fVar7 = (local_28._0_4_ * fVar1 + fVar7 * fVar2 + 1.0) / (fVar4 * fVar6);
  local_28 = (double)fVar7;
  if (1.0 < fVar7) {
    local_28 = (double)(-(ulong)(local_28 < 1.0001) & 0x3ff0000000000000 |
                       ~-(ulong)(local_28 < 1.0001) & (ulong)local_28);
  }
  uStack_20 = 0;
  dVar5 = acos(local_28);
  fVar7 = (float)((dVar5 * 180.0) / 3.141592653589793);
  if ((fVar7 < 0.0) || (180.0 <= fVar7)) {
    printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",(double)fVar7,
           local_28._0_4_,(double)fVar4,(double)fVar6);
    printf("va=(%f,%f) ve=(%f,%f)\n",(double)*va,SUB84((double)va[1],0),(double)*ve,(double)ve[1]);
  }
  return fVar7;
}

Assistant:

float PsiER(float ve[], float va[])
{
float nva;
float nve;
float v,r;
float VE[3],VA[3];

VE[0] = ve[0];
VE[1] = ve[1];
VE[2] = 1.0;

VA[0] = va[0];
VA[1] = va[1];
VA[2] = 1.0;

nva = norm(VA,3);
nve = norm(VE,3);
v =  (VE[0]*VA[0]+VE[1]*VA[1]+1.0f)/(nva*nve);

/**  sometimes roundoff error causes problems **/
if(v>1.0 && v < 1.0001) v = 1.0;

r = (float) (acos(v)*180.0/HALF_C);

if (!(r>=0.0 && r< 180.0))
{
printf("ERROR in PSIER()...\n r=%8.4f  v=%8.4f  nva=%8.4f nve= %8.4f\n",r,v,nva,nve);
printf("va=(%f,%f) ve=(%f,%f)\n",va[0],va[1],ve[0],ve[1]);
}

return r;
}